

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double expected_sd_cat_single<unsigned_long,unsigned_long,double>
                 (unsigned_long *counts,double *p,size_t n,unsigned_long *pos,size_t cat_exclude,
                 unsigned_long cnt)

{
  double dVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (cat_exclude == 0) {
    dVar7 = expected_sd_cat<unsigned_long,unsigned_long,double>(counts,p,n - 1,pos + 1);
    return dVar7;
  }
  if (n - 1 == cat_exclude) {
    dVar7 = expected_sd_cat<unsigned_long,unsigned_long,double>(counts,p,cat_exclude,pos);
    return dVar7;
  }
  uVar2 = pos[cat_exclude];
  lVar5 = cnt - counts[uVar2];
  auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar8._0_8_ = lVar5;
  auVar8._12_4_ = 0x45300000;
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    p[pos[sVar6]] =
         (((double)CONCAT44(0x45300000,(int)(counts[pos[sVar6]] >> 0x20)) - 1.9342813113834067e+25)
         + ((double)CONCAT44(0x43300000,(int)counts[pos[sVar6]]) - 4503599627370496.0)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  }
  dVar7 = p[*pos];
  auVar10._8_8_ = -dVar7 * dVar7;
  auVar10._0_8_ = dVar7;
  auVar8 = divpd(auVar10,_DAT_00325240);
  uVar3 = (ulong)(cat_exclude == 1) | 2;
  dVar1 = p[pos[(ulong)(cat_exclude == 1) + 1]];
  auVar9._8_8_ = dVar1 * dVar1;
  auVar9._0_8_ = dVar1;
  auVar10 = divpd(auVar9,_DAT_00325240);
  dVar7 = ((auVar8._8_8_ + dVar7 * dVar1 * -0.5 + auVar8._0_8_) - auVar10._8_8_) + auVar10._0_8_;
  for (; uVar3 < n; uVar3 = uVar3 + 1) {
    if (pos[uVar3] != uVar2) {
      dVar1 = p[pos[uVar3]];
      auVar11._8_8_ = dVar1 * dVar1;
      auVar11._0_8_ = dVar1;
      auVar8 = divpd(auVar11,_DAT_00325240);
      dVar7 = dVar7 + (auVar8._0_8_ - auVar8._8_8_);
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (pos[uVar4] != uVar2) {
          dVar7 = dVar7 + p[pos[uVar4]] * dVar1 * -0.5;
        }
      }
    }
  }
  if (dVar7 <= 0.0) {
    dVar7 = 0.0;
  }
  return SQRT(dVar7);
}

Assistant:

double expected_sd_cat_single(number *restrict counts, double *restrict p, size_t n, int_t *restrict pos, size_t cat_exclude, number cnt)
{
    if (cat_exclude == 0)
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos + 1);

    else if (cat_exclude == (n-1))
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos);

    size_t ix_exclude = pos[cat_exclude];

    ldouble_safe cnt_div = (ldouble_safe) (cnt - counts[ix_exclude]);
    for (size_t cat = 0; cat < n; cat++)
        p[pos[cat]] = (ldouble_safe)counts[pos[cat]] / cnt_div;

    ldouble_safe cum_var;
    if (cat_exclude != 1)
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[1]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[1]]) / 3.0 + p[pos[1]] / 3.0;
    else
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[2]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[2]]) / 3.0 + p[pos[2]] / 3.0;
    for (size_t cat1 = (cat_exclude == 1)? 3 : 2; cat1 < n; cat1++)
    {
        if (pos[cat1] == ix_exclude) continue;
        cum_var += p[pos[cat1]] / 3.0 - square(p[pos[cat1]]) / 3.0;
        for (size_t cat2 = 0; cat2 < cat1; cat2++)
        {
            if (pos[cat2] == ix_exclude) continue;
            cum_var -= p[pos[cat1]] * p[pos[cat2]] / 2.0;
        }

    }
    return std::sqrt(std::fmax(cum_var, (ldouble_safe)0));
}